

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

ComponentHandle<const_Position,_const_entityx::EntityManager> __thiscall
entityx::EntityManager::component<Position_const,void>(EntityManager *this,Id id)

{
  Family FVar1;
  EntityManager *pEVar2;
  Id IVar3;
  ComponentHandle<const_Position,_const_entityx::EntityManager> CVar4;
  
  FVar1 = Component<Position>::family();
  pEVar2 = (EntityManager *)0x0;
  IVar3.id_ = (uint64_t)(EntityManager *)0x0;
  if (FVar1 < (ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3)) {
    if (*(long *)(*(long *)(this + 0x18) + FVar1 * 8) == 0) {
      pEVar2 = (EntityManager *)0x0;
      IVar3.id_ = (uint64_t)(EntityManager *)0x0;
    }
    else {
      pEVar2 = this;
      IVar3.id_ = id.id_;
      if ((*(ulong *)(*(long *)(this + 0x48) + (id.id_ & 0xffffffff) * 8) >> (FVar1 & 0x3f) & 1) ==
          0) {
        pEVar2 = (EntityManager *)0x0;
        IVar3.id_ = (uint64_t)(EntityManager *)0x0;
      }
    }
  }
  CVar4.id_.id_ = IVar3.id_;
  CVar4.manager_ = pEVar2;
  return CVar4;
}

Assistant:

const ComponentHandle<C, const EntityManager> component(Entity::Id id) const {
    assert_valid(id);
    size_t family = component_family<C>();
    // We don't bother checking the component mask, as we return a nullptr anyway.
    if (family >= component_pools_.size())
      return ComponentHandle<C, const EntityManager>();
    BasePool *pool = component_pools_[family];
    if (!pool || !entity_component_mask_[id.index()][family])
      return ComponentHandle<C, const EntityManager>();
    return ComponentHandle<C, const EntityManager>(this, id);
  }